

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_Diablo3.cpp
# Opt level: O2

int RootHandler_CreateDiablo3(TCascStorage *hs,LPBYTE pbRootFile,DWORD cbRootFile)

{
  int iVar1;
  LPBYTE pBVar2;
  TDiabloRoot *this;
  DIABLO3_DIRECTORY RootDirectory;
  DIABLO3_DIRECTORY local_50;
  
  pBVar2 = TDiabloRoot::CaptureDirectoryData(&local_50,pbRootFile,cbRootFile);
  if (pBVar2 == (LPBYTE)0x0) {
    iVar1 = 1000;
  }
  else {
    this = (TDiabloRoot *)operator_new(0x7b8);
    TDiabloRoot::TDiabloRoot(this);
    iVar1 = TDiabloRoot::Load(this,hs,&local_50);
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_00115800;
    }
    (*(this->super_TFileTreeRoot).super_TRootHandler._vptr_TRootHandler[1])(this);
  }
  this = (TDiabloRoot *)0x0;
LAB_00115800:
  hs->pRootHandler = (TRootHandler *)this;
  return iVar1;
}

Assistant:

int RootHandler_CreateDiablo3(TCascStorage * hs, LPBYTE pbRootFile, DWORD cbRootFile)
{
    TDiabloRoot * pRootHandler = NULL;
    DIABLO3_DIRECTORY RootDirectory;
    int nError = ERROR_BAD_FORMAT;

    // Verify the header of the ROOT file
    if(TDiabloRoot::CaptureDirectoryData(RootDirectory, pbRootFile, cbRootFile) != NULL)
    {
        // Allocate the root handler object
        pRootHandler = new TDiabloRoot();
        if(pRootHandler != NULL)
        {
            // Load the root directory. If load failed, we free the object
            nError = pRootHandler->Load(hs, RootDirectory);
            if(nError != ERROR_SUCCESS)
            {
                delete pRootHandler;
                pRootHandler = NULL;
            }
        }
    }

    // Assign the root directory (or NULL) and return error
    hs->pRootHandler = pRootHandler;
    return nError;
}